

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_generated.h
# Opt level: O2

Offset<MyGame::Sample::Monster>
MyGame::Sample::CreateMonster
          (FlatBufferBuilder *_fbb,Vec3 *pos,int16_t mana,int16_t hp,
          Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory,Color color,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>_>
          weapons,Equipment equipped_type,Offset<void> equipped,
          Offset<flatbuffers::Vector<const_MyGame::Sample::Vec3_*,_unsigned_int>_> path)

{
  Offset<MyGame::Sample::Monster> OVar1;
  MonsterBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  MonsterBuilder::add_path(&local_40,path);
  MonsterBuilder::add_equipped(&local_40,equipped);
  MonsterBuilder::add_weapons(&local_40,weapons);
  MonsterBuilder::add_inventory(&local_40,inventory);
  MonsterBuilder::add_name(&local_40,name);
  MonsterBuilder::add_pos(&local_40,pos);
  MonsterBuilder::add_hp(&local_40,hp);
  MonsterBuilder::add_mana(&local_40,mana);
  MonsterBuilder::add_equipped_type(&local_40,equipped_type);
  MonsterBuilder::add_color(&local_40,color);
  OVar1 = MonsterBuilder::Finish(&local_40);
  return (Offset<MyGame::Sample::Monster>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Monster> CreateMonster(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    const MyGame::Sample::Vec3 *pos = nullptr,
    int16_t mana = 150,
    int16_t hp = 100,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> inventory = 0,
    MyGame::Sample::Color color = MyGame::Sample::Color_Blue,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Sample::Weapon>>> weapons = 0,
    MyGame::Sample::Equipment equipped_type = MyGame::Sample::Equipment_NONE,
    ::flatbuffers::Offset<void> equipped = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Sample::Vec3 *>> path = 0) {
  MonsterBuilder builder_(_fbb);
  builder_.add_path(path);
  builder_.add_equipped(equipped);
  builder_.add_weapons(weapons);
  builder_.add_inventory(inventory);
  builder_.add_name(name);
  builder_.add_pos(pos);
  builder_.add_hp(hp);
  builder_.add_mana(mana);
  builder_.add_equipped_type(equipped_type);
  builder_.add_color(color);
  return builder_.Finish();
}